

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
ResetAllocation(InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                *this,Allocation new_allocation,size_type new_size)

{
  ulong uVar1;
  ValueTypeBuffer VVar2;
  byte bVar3;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if ((uVar1 & 1) == 0) {
    if (uVar1 != 0) {
      memset(&this->rep_,0xab,(long)this + (uVar1 * 4 - (long)&this->rep_) + 8);
    }
    (this->rep_).inlined_storage.inlined[0] = (ValueTypeBuffer)new_allocation.capacity_;
  }
  else {
    bVar3 = 1;
    if (1 < uVar1) {
      memset((void *)(this->rep_).inlined_storage.inlined[1],0xab,(uVar1 & 0x3ffffffffffffffe) << 2)
      ;
      bVar3 = (byte)(this->allocator_and_tag_).tag_.size_ & 1;
    }
    VVar2 = (this->rep_).inlined_storage.inlined[1];
    if ((ValueTypeBuffer)&this->rep_ != VVar2 && bVar3 == 0) {
      __assert_fail("begin() == allocated_space()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                    ,0x31b,
                    "void absl::InlinedVector<const S2ShapeIndexCell *, 6>::ResetAllocation(Allocation, size_type) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>]"
                   );
    }
    operator_delete((void *)VVar2);
    (this->rep_).inlined_storage.inlined[0] = (ValueTypeBuffer)new_allocation.capacity_;
  }
  (this->rep_).inlined_storage.inlined[1] = (ValueTypeBuffer)new_allocation.buffer_;
  (this->allocator_and_tag_).tag_.size_ = new_size * 2 + 1;
  return;
}

Assistant:

void ResetAllocation(Allocation new_allocation, size_type new_size) {
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + size());
      assert(begin() == allocated_space());
      allocation().Dealloc(allocator());
      allocation() = new_allocation;
    } else {
      Destroy(inlined_space(), inlined_space() + size());
      init_allocation(new_allocation);  // bug: only init once
    }
    tag().set_allocated_size(new_size);
  }